

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*>
slang::ast::getDirAndType(Symbol *port)

{
  PortSymbol *this;
  Type *pTVar1;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar2;
  
  if (port->kind == Port) {
    this = Symbol::as<slang::ast::PortSymbol>(port);
    pTVar1 = PortSymbol::getType(this);
  }
  else {
    this = (PortSymbol *)Symbol::as<slang::ast::MultiPortSymbol>(port);
    pTVar1 = MultiPortSymbol::getType((MultiPortSymbol *)this);
  }
  pVar2._4_4_ = 0;
  pVar2.first = this->direction;
  pVar2.second = pTVar1;
  return pVar2;
}

Assistant:

static std::pair<ArgumentDirection, const Type*> getDirAndType(const Symbol& port) {
    if (port.kind == SymbolKind::Port) {
        auto& ps = port.as<PortSymbol>();
        return {ps.direction, &ps.getType()};
    }
    else {
        auto& mp = port.as<MultiPortSymbol>();
        return {mp.direction, &mp.getType()};
    }
}